

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::im2col_sgemm_pack8to4_int8_sse_xop
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  uint uVar2;
  int iVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint _c;
  undefined8 uVar13;
  int *piVar14;
  ulong uVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 (*pauVar22) [16];
  undefined8 *puVar23;
  int q;
  ulong uVar24;
  long lVar25;
  undefined8 *puVar26;
  ulong uVar27;
  int iVar28;
  bool bVar29;
  undefined1 local_98 [64];
  size_t local_58;
  ulong local_48;
  Mat *local_40;
  void *local_38;
  
  uVar2 = bottom_im2col->w;
  uVar27 = (ulong)(int)uVar2;
  iVar3 = bottom_im2col->h;
  uVar17 = bottom_im2col->c;
  local_48 = (ulong)(uint)top_blob->c;
  local_58 = 0;
  local_98._16_8_ = 0;
  local_98._24_4_ = 0;
  local_98._0_8_ = (void *)0x0;
  local_98._8_4_ = 0;
  local_98._12_4_ = 0;
  local_98._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_98._32_8_ = (Allocator *)0x0;
  local_98._40_4_ = 0;
  local_98._44_4_ = 0;
  _c = (uVar2 & 1) + (uVar2 >> 1);
  if ((long)uVar27 < 2) {
    _c = uVar2;
  }
  local_40 = top_blob;
  Mat::create((Mat *)local_98,iVar3 << (1 < (long)uVar27),uVar17,_c,8,8,opt->workspace_allocator);
  uVar15 = 0;
  iVar28 = 0;
  if (0 < iVar3) {
    iVar28 = iVar3;
  }
  uVar21 = 0;
  if (0 < (int)uVar17) {
    uVar21 = (ulong)uVar17;
  }
  uVar20 = (ulong)(uint)((int)uVar2 >> 1);
  if ((int)uVar2 >> 1 < 1) {
    uVar20 = uVar15;
  }
  for (uVar18 = 0; uVar18 != uVar20; uVar18 = uVar18 + 1) {
    puVar23 = (undefined8 *)(local_58 * uVar18 * local_98._16_8_ + local_98._0_8_);
    for (uVar24 = 0; uVar24 != uVar21; uVar24 = uVar24 + 1) {
      puVar26 = (undefined8 *)
                ((long)bottom_im2col->data +
                bottom_im2col->cstep * bottom_im2col->elemsize * uVar24 + uVar15);
      iVar19 = iVar28;
      while (bVar29 = iVar19 != 0, iVar19 = iVar19 + -1, bVar29) {
        uVar13 = puVar26[1];
        *puVar23 = *puVar26;
        puVar23[1] = uVar13;
        puVar23 = puVar23 + 2;
        puVar26 = puVar26 + uVar27;
      }
    }
    uVar15 = uVar15 + 0x10;
  }
  uVar15 = uVar27 & 0xfffffffffffffffe;
  local_38 = (void *)local_98._0_8_;
  lVar25 = uVar15 * 8;
  for (; (long)uVar15 < (long)uVar27; uVar15 = uVar15 + 1) {
    uVar20 = (ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff;
    puVar23 = (undefined8 *)
              ((long)((int)((long)uVar20 % 2) + (int)((long)uVar20 / 2)) * local_58 *
               local_98._16_8_ + local_98._0_8_);
    pvVar4 = bottom_im2col->data;
    for (uVar20 = 0; uVar20 != uVar21; uVar20 = uVar20 + 1) {
      puVar26 = (undefined8 *)
                ((long)pvVar4 + bottom_im2col->cstep * bottom_im2col->elemsize * uVar20 + lVar25);
      iVar19 = iVar28;
      while (bVar29 = iVar19 != 0, iVar19 = iVar19 + -1, bVar29) {
        *puVar23 = *puVar26;
        puVar23 = puVar23 + 1;
        puVar26 = puVar26 + uVar27;
      }
    }
    lVar25 = lVar25 + 8;
  }
  uVar15 = 0;
  iVar28 = uVar17 * iVar3;
  if ((int)(uVar17 * iVar3) < 1) {
    iVar28 = 0;
  }
  uVar21 = local_48 & 0xffffffff;
  if ((int)local_48 < 1) {
    uVar21 = uVar15;
  }
  do {
    if (uVar15 == uVar21) {
      piVar14 = (int *)CONCAT44(local_98._12_4_,local_98._8_4_);
      if (piVar14 != (int *)0x0) {
        LOCK();
        *piVar14 = *piVar14 + -1;
        UNLOCK();
        if (*piVar14 == 0) {
          if ((Allocator *)local_98._32_8_ == (Allocator *)0x0) {
            free((void *)local_98._0_8_);
          }
          else {
            (*(*(_func_int ***)local_98._32_8_)[3])(0);
          }
        }
      }
      return;
    }
    pauVar16 = (undefined1 (*) [16])
               (local_40->cstep * uVar15 * local_40->elemsize + (long)local_40->data);
    lVar25 = 0;
    for (uVar20 = 0; (long)(uVar20 | 1) < (long)uVar27; uVar20 = uVar20 + 2) {
      pauVar22 = (undefined1 (*) [16])
                 (kernel->cstep * uVar15 * kernel->elemsize + (long)kernel->data);
      if (iVar28 != 0) {
        auVar1 = *(undefined1 (*) [16])(local_58 * local_98._16_8_ * lVar25 + local_98._0_8_);
        auVar5 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        vpunpcklbw_avx(auVar1,auVar5);
        vpunpckhbw_avx(auVar1,auVar5);
        auVar1 = *pauVar22;
        auVar5 = pauVar22[1];
        auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar5);
        vpunpcklbw_avx(auVar1,auVar6);
        vpunpckhbw_avx(auVar1,auVar6);
        vpunpcklbw_avx(auVar5,auVar7);
        vpunpckhbw_avx(auVar5,auVar7);
        halt_baddata();
      }
      auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar9 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar5 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar10 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar11 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar7 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar8 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar12 = vpunpcklqdq_avx(auVar1,auVar9);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar9);
      auVar1 = vpaddd_avx(auVar12,auVar1);
      auVar9 = vpunpcklqdq_avx(auVar5,auVar6);
      auVar5 = vpunpckhqdq_avx(auVar5,auVar6);
      auVar5 = vpaddd_avx(auVar5,auVar9);
      auVar1 = vpaddd_avx(auVar1,auVar5);
      auVar6 = vpunpcklqdq_avx(auVar10,auVar11);
      auVar5 = vpunpckhqdq_avx(auVar10,auVar11);
      auVar5 = vpaddd_avx(auVar6,auVar5);
      auVar9 = vpunpcklqdq_avx(auVar7,auVar8);
      auVar6 = vpunpckhqdq_avx(auVar7,auVar8);
      auVar6 = vpaddd_avx(auVar6,auVar9);
      auVar5 = vpaddd_avx(auVar5,auVar6);
      *pauVar16 = auVar1;
      pauVar16[1] = auVar5;
      pauVar16 = pauVar16 + 2;
      lVar25 = lVar25 + 1;
    }
    while (uVar17 = (uint)uVar20, (int)uVar17 < (int)uVar2) {
      pauVar22 = (undefined1 (*) [16])
                 (kernel->cstep * uVar15 * kernel->elemsize + (long)kernel->data);
      if (iVar28 != 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = *(ulong *)(local_58 * local_98._16_8_ *
                                  (ulong)((uVar17 & 1) + ((uint)(uVar20 >> 1) & 0x7fffffff)) +
                                 local_98._0_8_);
        vpmovsxbw_avx(auVar1);
        auVar1 = *pauVar22;
        auVar5 = pauVar22[1];
        auVar6 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
        auVar7 = vpcmpgtb_avx((undefined1  [16])0x0,auVar5);
        vpunpcklbw_avx(auVar1,auVar6);
        vpunpckhbw_avx(auVar1,auVar6);
        vpunpcklbw_avx(auVar5,auVar7);
        vpunpckhbw_avx(auVar5,auVar7);
        halt_baddata();
      }
      auVar1 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar7 = vpunpckldq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar5 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar6 = vpunpckhdq_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      auVar8 = vpunpcklqdq_avx(auVar1,auVar7);
      auVar1 = vpunpckhqdq_avx(auVar1,auVar7);
      auVar1 = vpaddd_avx(auVar8,auVar1);
      auVar7 = vpunpcklqdq_avx(auVar5,auVar6);
      auVar5 = vpunpckhqdq_avx(auVar5,auVar6);
      auVar5 = vpaddd_avx(auVar5,auVar7);
      auVar1 = vpaddd_avx(auVar1,auVar5);
      *pauVar16 = auVar1;
      pauVar16 = pauVar16 + 1;
      uVar20 = (ulong)(uVar17 + 1);
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

void im2col_sgemm_pack8to4_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_pack8to4_int8_sse(bottom_im2col, top_blob, kernel, opt);
}